

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::call_stat_prop(vm_val_t *result,uchar **pc_ptr,uint *argc,vm_prop_id_t prop)

{
  int iVar1;
  
  iVar1 = CVmMetaTable::prop_to_vector_idx(G_meta_table_X,metaclass_reg_->meta_reg_idx_,prop);
  if (iVar1 == 0x14) {
    static_getp_packBytes(result,argc);
    return 1;
  }
  iVar1 = CVmObject::call_stat_prop(result,pc_ptr,argc,prop);
  return iVar1;
}

Assistant:

int CVmObjString::call_stat_prop(VMG_ vm_val_t *result,
                                 const uchar **pc_ptr, uint *argc,
                                 vm_prop_id_t prop)
{
    /* get the function table index */
    int idx = G_meta_table->prop_to_vector_idx(
        metaclass_reg_->get_reg_idx(), prop);

    /* check for static methods */
    switch (idx)
    {
    case PROPIDX_packBytes:
        return static_getp_packBytes(vmg_ result, argc);

    default:
        /* inherit the default handling */
        return CVmObject::call_stat_prop(vmg_ result, pc_ptr, argc, prop);
    }
}